

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureMipmapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Accuracy::TextureCubeMipmapCase::init(TextureCubeMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  uint uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  TextureCube *this_01;
  ulong uVar5;
  ulong extraout_RAX;
  int levelNdx;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  RGBA local_1c4;
  ulong local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [384];
  
  iVar4 = (*this->m_renderCtxInfo->_vptr_ContextInfo[7])();
  if ((char)iVar4 == '\0') {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Warning: High precision not supported in fragment shaders.")
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  this_01 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (this_01,this->m_renderCtx,this->m_format,this->m_dataType,this->m_size);
  this->m_texture = this_01;
  uVar1 = this->m_size;
  uVar5 = 0x20;
  if (uVar1 != 0) {
    uVar3 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar5 = (ulong)(uVar3 ^ 0x1f);
  }
  iVar4 = (int)uVar5;
  uVar7 = 0;
  do {
    if (uVar7 == 6) {
      return (int)uVar5;
    }
    local_1c0 = uVar7 & 0xffffffff;
    uVar5 = uVar7 * 0x18;
    lVar8 = 0;
    local_1b8 = uVar5;
    for (uVar6 = 0; 0x20 - iVar4 != uVar6; uVar6 = uVar6 + 1) {
      if ((CubeFace)uVar7 < CUBEFACE_LAST) {
        iVar4 = (*(code *)(&DAT_018015a4 + *(int *)(&DAT_018015a4 + local_1c0 * 4)))();
        return iVar4;
      }
      tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)uVar7,(int)uVar6);
      lVar2 = *(long *)((long)&(this->m_texture->m_refTexture).m_access[0].
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_1b8);
      local_1c4.m_value = 0xff000000;
      tcu::RGBA::toVec(&local_1c4);
      tcu::clear((PixelBufferAccess *)(lVar2 + lVar8),(Vec4 *)local_1b0);
      lVar8 = lVar8 + 0x28;
      uVar5 = extraout_RAX;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void TextureCubeMipmapCase::init (void)
{
	if (!m_renderCtxInfo.isFragmentHighPrecisionSupported())
		m_testCtx.getLog() << TestLog::Message << "Warning: High precision not supported in fragment shaders." << TestLog::EndMessage;

	m_texture = new TextureCube(m_renderCtx, m_format, m_dataType, m_size);

	int numLevels = deLog2Floor32(m_size)+1;

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}